

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

bool __thiscall TTD::ExecutionInfoManager::IsFinalSourceLine(ExecutionInfoManager *this)

{
  bool bVar1;
  uint startOffset_00;
  uint32 local_28;
  uint32 startOffset;
  LONG srcColumn;
  ULONG srcLine;
  SingleCallCounter *cfinfo;
  ExecutionInfoManager *this_local;
  
  cfinfo = (SingleCallCounter *)this;
  _srcColumn = GetTopCallCounter(this);
  bVar1 = TTInnerLoopLastStatementInfo::CheckLastTimeMatch
                    (&this->m_innerloopLastLocation,this->m_topLevelCallbackEventTime,
                     _srcColumn->FunctionTime,_srcColumn->LoopTime);
  if (bVar1) {
    startOffset = 0;
    local_28 = 0xffffffff;
    startOffset_00 =
         Js::FunctionBody::GetStatementStartOffset
                   (_srcColumn->Function,_srcColumn->CurrentStatementIndex);
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD
              (_srcColumn->Function,startOffset_00,&startOffset,(LONG *)&local_28);
    this_local._7_1_ =
         TTInnerLoopLastStatementInfo::CheckLineColumnMatch
                   (&this->m_innerloopLastLocation,startOffset,local_28);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutionInfoManager::IsFinalSourceLine() const
    {
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        if(!this->m_innerloopLastLocation.CheckLastTimeMatch(this->m_topLevelCallbackEventTime, cfinfo.FunctionTime, cfinfo.LoopTime))
        {
            return false;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = cfinfo.Function->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
        cfinfo.Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);
        return this->m_innerloopLastLocation.CheckLineColumnMatch((uint32) srcLine, (uint32)srcColumn);
    }